

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void printRegisterList(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  uint8_t uVar4;
  uint uVar5;
  uint uVar6;
  MCOperand *pMVar7;
  int iVar8;
  
  SStream_concat0(O,"{");
  pcVar2 = MI->csh;
  iVar8 = 0;
  if (pcVar2->detail == CS_OPT_OFF) {
    uVar4 = '\0';
  }
  else {
    uVar5 = MCInst_getOpcode(MI);
    uVar4 = get_op_access(pcVar2,uVar5,(uint)MI->ac_idx);
  }
  uVar5 = MCInst_getNumOperands(MI);
  for (; (OpNum - uVar5) + iVar8 != 0; iVar8 = iVar8 + 1) {
    if (iVar8 != 0) {
      SStream_concat0(O,", ");
    }
    pcVar2 = MI->csh;
    pMVar7 = MCInst_getOperand(MI,OpNum + iVar8);
    uVar6 = MCOperand_getReg(pMVar7);
    printRegName(pcVar2,O,uVar6);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar3 = MI->flat_insn->detail;
      puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x30 + 0x41;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pMVar7 = MCInst_getOperand(MI,OpNum + iVar8);
      uVar6 = MCOperand_getReg(pMVar7);
      pcVar3 = MI->flat_insn->detail;
      *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x30 + 0x45) = uVar6;
      pcVar3 = MI->flat_insn->detail;
      pcVar3->groups[(ulong)(pcVar3->field_6).arm.op_count * 0x30 + 0x5e] = uVar4;
      puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  SStream_concat0(O,"}");
  if (MI->csh->detail != CS_OPT_OFF) {
    MI->ac_idx = MI->ac_idx + '\x01';
  }
  return;
}

Assistant:

static void printRegisterList(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned i, e;
#ifndef CAPSTONE_DIET
	uint8_t access = 0;
#endif

	SStream_concat0(O, "{");

#ifndef CAPSTONE_DIET
	if (MI->csh->detail) {
		access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
	}
#endif

	for (i = OpNum, e = MCInst_getNumOperands(MI); i != e; ++i) {
		if (i != OpNum) SStream_concat0(O, ", ");
		printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, i)));
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, i));
#ifndef CAPSTONE_DIET
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = access;
#endif
			MI->flat_insn->detail->arm.op_count++;
		}
	}
	SStream_concat0(O, "}");

#ifndef CAPSTONE_DIET
	if (MI->csh->detail) {
		MI->ac_idx++;
	}
#endif
}